

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorBeginInfoEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  undefined8 uVar2;
  XrPlaneDetectorBeginInfoEXT *pXVar3;
  bool bVar4;
  XrInstance pXVar5;
  ostream *poVar6;
  XrPosef *value_01;
  XrExtent3Df *value_02;
  invalid_argument *piVar7;
  allocator local_f21;
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [8];
  string boundingboxextent_prefix;
  allocator local_eb9;
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [8];
  string boundingboxpose_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e58 [36];
  int local_e34;
  ostringstream local_e30 [8];
  ostringstream oss_minArea;
  string local_cb8 [8];
  string minarea_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98 [32];
  ostringstream local_c78 [8];
  ostringstream oss_maxPlanes;
  string local_b00 [8];
  string maxplanes_prefix;
  __cxx11 local_ae0 [32];
  __cxx11 local_ac0 [32];
  string local_aa0 [8];
  string semantictypes_array_prefix;
  uint local_a7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [4];
  uint32_t value_semantictypes_inc;
  ostringstream local_a58 [8];
  ostringstream oss_semanticTypes_array;
  string local_8e0 [8];
  string semantictypes_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0 [32];
  ostringstream local_8a0 [8];
  ostringstream oss_semanticTypeCount;
  string local_728 [8];
  string semantictypecount_prefix;
  __cxx11 local_708 [32];
  __cxx11 local_6e8 [32];
  string local_6c8 [8];
  string orientations_array_prefix;
  uint local_6a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0 [4];
  uint32_t value_orientations_inc;
  ostringstream local_680 [8];
  ostringstream oss_orientations_array;
  string local_508 [8];
  string orientations_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8 [32];
  ostringstream local_4c8 [8];
  ostringstream oss_orientationCount;
  string local_350 [8];
  string orientationcount_prefix;
  __cxx11 local_330 [32];
  string local_310 [8];
  string time_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  ostringstream local_2d0 [8];
  ostringstream oss_baseSpace;
  string local_158 [8];
  string basespace_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  undefined1 local_60 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrPlaneDetectorBeginInfoEXT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60._32_8_ = contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrPlaneDetectorBeginInfoEXT *)gen_dispatch_table;
  PointerToHexString<XrPlaneDetectorBeginInfoEXT>((XrPlaneDetectorBeginInfoEXT *)local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  uVar2 = local_60._32_8_;
  if (value_local == (XrPlaneDetectorBeginInfoEXT *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = *(code **)&value_local->maxPlanes;
    pXVar5 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar5,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60._32_8_,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar3 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar4 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar3,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_138);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_158,(string *)prefix);
    std::__cxx11::string::operator+=(local_158,"baseSpace");
    std::__cxx11::ostringstream::ostringstream(local_2d0);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_2d0,std::hex);
    std::ostream::operator<<(poVar6,*(void **)(prefix_local + 0x10));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [8])"XrSpace",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               local_2f0);
    std::__cxx11::string::~string((string *)local_2f0);
    std::__cxx11::string::string(local_310,(string *)prefix);
    std::__cxx11::string::operator+=(local_310,"time");
    uVar2 = local_60._32_8_;
    std::__cxx11::to_string(local_330,*(long *)(prefix_local + 0x18));
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [7])"XrTime",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    std::__cxx11::string::~string((string *)local_330);
    std::__cxx11::string::string(local_350,(string *)prefix);
    std::__cxx11::string::operator+=(local_350,"orientationCount");
    std::__cxx11::ostringstream::ostringstream(local_4c8);
    poVar6 = std::operator<<((ostream *)local_4c8,"0x");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
    std::ostream::operator<<(poVar6,*(uint *)(prefix_local + 0x20));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [9])"uint32_t",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
               local_4e8);
    std::__cxx11::string::~string((string *)local_4e8);
    std::__cxx11::string::string(local_508,(string *)prefix);
    std::__cxx11::string::operator+=(local_508,"orientations");
    std::__cxx11::ostringstream::ostringstream(local_680);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_680,std::hex);
    std::ostream::operator<<(poVar6,*(void **)(prefix_local + 0x28));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
               local_6a0);
    std::__cxx11::string::~string((string *)local_6a0);
    for (local_6a4 = 0; local_6a4 < *(uint *)(prefix_local + 0x20); local_6a4 = local_6a4 + 1) {
      std::__cxx11::string::string(local_6c8,local_508);
      std::__cxx11::string::operator+=(local_6c8,"[");
      std::__cxx11::to_string(local_6e8,local_6a4);
      std::__cxx11::string::operator+=(local_6c8,(string *)local_6e8);
      std::__cxx11::string::~string((string *)local_6e8);
      std::__cxx11::string::operator+=(local_6c8,"]");
      uVar2 = local_60._32_8_;
      std::__cxx11::to_string
                (local_708,*(int *)(*(long *)(prefix_local + 0x28) + (ulong)local_6a4 * 4));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708);
      std::__cxx11::string::~string((string *)local_708);
      std::__cxx11::string::~string(local_6c8);
    }
    std::__cxx11::string::string(local_728,(string *)prefix);
    std::__cxx11::string::operator+=(local_728,"semanticTypeCount");
    std::__cxx11::ostringstream::ostringstream(local_8a0);
    poVar6 = std::operator<<((ostream *)local_8a0,"0x");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
    std::ostream::operator<<(poVar6,*(uint *)(prefix_local + 0x30));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [9])"uint32_t",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728,
               local_8c0);
    std::__cxx11::string::~string((string *)local_8c0);
    std::__cxx11::string::string(local_8e0,(string *)prefix);
    std::__cxx11::string::operator+=(local_8e0,"semanticTypes");
    std::__cxx11::ostringstream::ostringstream(local_a58);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_a58,std::hex);
    std::ostream::operator<<(poVar6,*(void **)(prefix_local + 0x38));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0,
               local_a78);
    std::__cxx11::string::~string((string *)local_a78);
    for (local_a7c = 0; local_a7c < *(uint *)(prefix_local + 0x30); local_a7c = local_a7c + 1) {
      std::__cxx11::string::string(local_aa0,local_8e0);
      std::__cxx11::string::operator+=(local_aa0,"[");
      std::__cxx11::to_string(local_ac0,local_a7c);
      std::__cxx11::string::operator+=(local_aa0,(string *)local_ac0);
      std::__cxx11::string::~string((string *)local_ac0);
      std::__cxx11::string::operator+=(local_aa0,"]");
      uVar2 = local_60._32_8_;
      std::__cxx11::to_string
                (local_ae0,*(int *)(*(long *)(prefix_local + 0x38) + (ulong)local_a7c * 4));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae0);
      std::__cxx11::string::~string((string *)local_ae0);
      std::__cxx11::string::~string(local_aa0);
    }
    std::__cxx11::string::string(local_b00,(string *)prefix);
    std::__cxx11::string::operator+=(local_b00,"maxPlanes");
    std::__cxx11::ostringstream::ostringstream(local_c78);
    poVar6 = std::operator<<((ostream *)local_c78,"0x");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
    std::ostream::operator<<(poVar6,*(uint *)(prefix_local + 0x40));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [9])"uint32_t",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b00,
               local_c98);
    std::__cxx11::string::~string((string *)local_c98);
    std::__cxx11::string::string(local_cb8,(string *)prefix);
    std::__cxx11::string::operator+=(local_cb8,"minArea");
    std::__cxx11::ostringstream::ostringstream(local_e30);
    local_e34 = (int)std::setprecision(0x20);
    poVar6 = std::operator<<((ostream *)local_e30,(_Setprecision)local_e34);
    std::ostream::operator<<(poVar6,*(float *)(prefix_local + 0x44));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [6])"float",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cb8,
               local_e58);
    std::__cxx11::string::~string((string *)local_e58);
    std::__cxx11::string::string(local_e78,(string *)prefix);
    std::__cxx11::string::operator+=(local_e78,"boundingBoxPose");
    pXVar3 = value_local;
    value_01 = (XrPosef *)(prefix_local + 0x48);
    std::__cxx11::string::string(local_e98,local_e78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb8,"XrPosef",&local_eb9);
    bVar4 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar3,value_01,(string *)local_e98,
                       (string *)local_eb8,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_60._32_8_);
    std::__cxx11::string::~string(local_eb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
    std::__cxx11::string::~string(local_e98);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string(local_ee0,(string *)prefix);
      std::__cxx11::string::operator+=(local_ee0,"boundingBoxExtent");
      pXVar3 = value_local;
      value_02 = (XrExtent3Df *)(prefix_local + 100);
      std::__cxx11::string::string(local_f00,local_ee0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f20,"XrExtent3DfEXT",&local_f21);
      bVar4 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)pXVar3,value_02,(string *)local_f00,
                         (string *)local_f20,false,
                         (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_60._32_8_);
      std::__cxx11::string::~string(local_f20);
      std::allocator<char>::~allocator((allocator<char> *)&local_f21);
      std::__cxx11::string::~string(local_f00);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        gen_dispatch_table_local._7_1_ = 1;
        std::__cxx11::string::~string(local_ee0);
        std::__cxx11::string::~string(local_e78);
        std::__cxx11::ostringstream::~ostringstream(local_e30);
        std::__cxx11::string::~string(local_cb8);
        std::__cxx11::ostringstream::~ostringstream(local_c78);
        std::__cxx11::string::~string(local_b00);
        std::__cxx11::ostringstream::~ostringstream(local_a58);
        std::__cxx11::string::~string(local_8e0);
        std::__cxx11::ostringstream::~ostringstream(local_8a0);
        std::__cxx11::string::~string(local_728);
        std::__cxx11::ostringstream::~ostringstream(local_680);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::ostringstream::~ostringstream(local_4c8);
        std::__cxx11::string::~string(local_350);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::ostringstream::~ostringstream(local_2d0);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_90);
        return (bool)(gen_dispatch_table_local._7_1_ & 1);
      }
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorBeginInfoEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string orientationcount_prefix = prefix;
        orientationcount_prefix += "orientationCount";
        std::ostringstream oss_orientationCount;
        oss_orientationCount << "0x" << std::hex << (value->orientationCount);
        contents.emplace_back("uint32_t", orientationcount_prefix, oss_orientationCount.str());
        std::string orientations_prefix = prefix;
        orientations_prefix += "orientations";
        std::ostringstream oss_orientations_array;
        oss_orientations_array << std::hex << reinterpret_cast<const void*>(value->orientations);
        contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_prefix, oss_orientations_array.str());
        for (uint32_t value_orientations_inc = 0; value_orientations_inc < value->orientationCount; ++value_orientations_inc) {
            std::string orientations_array_prefix = orientations_prefix;
            orientations_array_prefix += "[";
            orientations_array_prefix += std::to_string(value_orientations_inc);
            orientations_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_array_prefix, std::to_string(value->orientations[value_orientations_inc]));
        }
        std::string semantictypecount_prefix = prefix;
        semantictypecount_prefix += "semanticTypeCount";
        std::ostringstream oss_semanticTypeCount;
        oss_semanticTypeCount << "0x" << std::hex << (value->semanticTypeCount);
        contents.emplace_back("uint32_t", semantictypecount_prefix, oss_semanticTypeCount.str());
        std::string semantictypes_prefix = prefix;
        semantictypes_prefix += "semanticTypes";
        std::ostringstream oss_semanticTypes_array;
        oss_semanticTypes_array << std::hex << reinterpret_cast<const void*>(value->semanticTypes);
        contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_prefix, oss_semanticTypes_array.str());
        for (uint32_t value_semantictypes_inc = 0; value_semantictypes_inc < value->semanticTypeCount; ++value_semantictypes_inc) {
            std::string semantictypes_array_prefix = semantictypes_prefix;
            semantictypes_array_prefix += "[";
            semantictypes_array_prefix += std::to_string(value_semantictypes_inc);
            semantictypes_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_array_prefix, std::to_string(value->semanticTypes[value_semantictypes_inc]));
        }
        std::string maxplanes_prefix = prefix;
        maxplanes_prefix += "maxPlanes";
        std::ostringstream oss_maxPlanes;
        oss_maxPlanes << "0x" << std::hex << (value->maxPlanes);
        contents.emplace_back("uint32_t", maxplanes_prefix, oss_maxPlanes.str());
        std::string minarea_prefix = prefix;
        minarea_prefix += "minArea";
        std::ostringstream oss_minArea;
        oss_minArea << std::setprecision(32) << (value->minArea);
        contents.emplace_back("float", minarea_prefix, oss_minArea.str());
        std::string boundingboxpose_prefix = prefix;
        boundingboxpose_prefix += "boundingBoxPose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxPose, boundingboxpose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string boundingboxextent_prefix = prefix;
        boundingboxextent_prefix += "boundingBoxExtent";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxExtent, boundingboxextent_prefix, "XrExtent3DfEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}